

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

CmpResultSet
tcu::execCompare(CompareMode compareMode,float cmpValue_,float cmpReference_,int referenceBits,
                bool isFixedPoint)

{
  byte bVar1;
  ushort uVar2;
  undefined3 in_register_00000011;
  bool bVar3;
  float fVar4;
  
  if (CONCAT31(in_register_00000011,isFixedPoint) != 0) {
    fVar4 = 1.0;
    if (cmpValue_ <= 1.0) {
      fVar4 = cmpValue_;
    }
    cmpValue_ = (float)(~-(uint)(cmpValue_ < 0.0) & (uint)fVar4);
  }
  if (isFixedPoint) {
    fVar4 = 1.0;
    if (cmpReference_ <= 1.0) {
      fVar4 = cmpReference_;
    }
    cmpReference_ = (float)(~-(uint)(cmpReference_ < 0.0) & (uint)fVar4);
  }
  fVar4 = TexVerifierUtil::computeFixedPointError(referenceBits);
  switch(compareMode) {
  case COMPAREMODE_LESS:
    bVar1 = cmpReference_ - fVar4 < cmpValue_;
    bVar3 = cmpReference_ + fVar4 < cmpValue_;
    goto LAB_01a01a6d;
  case COMPAREMODE_LESS_OR_EQUAL:
    bVar1 = cmpReference_ - fVar4 <= cmpValue_;
    fVar4 = cmpReference_ + fVar4;
    bVar3 = fVar4 < cmpValue_;
    goto LAB_01a01ab5;
  case COMPAREMODE_GREATER:
    bVar1 = cmpValue_ < cmpReference_ + fVar4;
    bVar3 = cmpValue_ < cmpReference_ - fVar4;
LAB_01a01a6d:
    uVar2 = (ushort)!bVar3;
    break;
  case COMPAREMODE_GREATER_OR_EQUAL:
    bVar1 = cmpValue_ <= cmpReference_ + fVar4;
    fVar4 = cmpReference_ - fVar4;
    bVar3 = cmpValue_ < fVar4;
LAB_01a01ab5:
    uVar2 = (ushort)(!bVar3 && cmpValue_ != fVar4);
    break;
  case COMPAREMODE_EQUAL:
    bVar1 = -(cmpReference_ - fVar4 <= cmpValue_ && cmpValue_ <= fVar4 + cmpReference_);
    uVar2 = -(ushort)(fVar4 != 0.0 || cmpValue_ != cmpReference_);
    break;
  case COMPAREMODE_NOT_EQUAL:
    bVar1 = -(cmpValue_ != cmpReference_) | -(fVar4 != 0.0);
    uVar2 = -(ushort)(cmpValue_ <= cmpReference_ + fVar4 && cmpReference_ - fVar4 <= cmpValue_);
    break;
  case COMPAREMODE_ALWAYS:
    bVar1 = 1;
    uVar2 = 0;
    break;
  case COMPAREMODE_NEVER:
    uVar2 = 1;
    goto LAB_01a01afc;
  default:
    uVar2 = 0;
LAB_01a01afc:
    bVar1 = 0;
  }
  return (CmpResultSet)(bVar1 & 1 | (uVar2 & 1) << 8);
}

Assistant:

static CmpResultSet execCompare (const Sampler::CompareMode	compareMode,
								 const float				cmpValue_,
								 const float				cmpReference_,
								 const int					referenceBits,
								 const bool					isFixedPoint)
{
	const bool		clampValues		= isFixedPoint;	// if comparing against a floating point texture, ref (and value) is not clamped
	const float		cmpValue		= (clampValues) ? (de::clamp(cmpValue_, 0.0f, 1.0f)) : (cmpValue_);
	const float		cmpReference	= (clampValues) ? (de::clamp(cmpReference_, 0.0f, 1.0f)) : (cmpReference_);
	const float		err				= computeFixedPointError(referenceBits);
	CmpResultSet	res;

	switch (compareMode)
	{
		case Sampler::COMPAREMODE_LESS:
			res.isTrue	= cmpReference-err < cmpValue;
			res.isFalse	= cmpReference+err >= cmpValue;
			break;

		case Sampler::COMPAREMODE_LESS_OR_EQUAL:
			res.isTrue	= cmpReference-err <= cmpValue;
			res.isFalse	= cmpReference+err > cmpValue;
			break;

		case Sampler::COMPAREMODE_GREATER:
			res.isTrue	= cmpReference+err > cmpValue;
			res.isFalse	= cmpReference-err <= cmpValue;
			break;

		case Sampler::COMPAREMODE_GREATER_OR_EQUAL:
			res.isTrue	= cmpReference+err >= cmpValue;
			res.isFalse	= cmpReference-err < cmpValue;
			break;

		case Sampler::COMPAREMODE_EQUAL:
			res.isTrue	= de::inRange(cmpValue, cmpReference-err, cmpReference+err);
			res.isFalse	= err != 0.0f || cmpValue != cmpReference;
			break;

		case Sampler::COMPAREMODE_NOT_EQUAL:
			res.isTrue	= err != 0.0f || cmpValue != cmpReference;
			res.isFalse	= de::inRange(cmpValue, cmpReference-err, cmpReference+err);
			break;

		case Sampler::COMPAREMODE_ALWAYS:
			res.isTrue	= true;
			break;

		case Sampler::COMPAREMODE_NEVER:
			res.isFalse	= true;
			break;

		default:
			DE_ASSERT(false);
	}

	DE_ASSERT(res.isTrue || res.isFalse);
	return res;
}